

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::parse(App *this,string *commandline,bool program_name_included)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  undefined7 in_register_00000011;
  _func_unsigned_long_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_unsigned_long
  *in_R8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  nstr;
  string local_100;
  string local_e0 [32];
  string local_c0;
  string local_a0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if ((int)CONCAT71(in_register_00000011,program_name_included) == 0) {
    detail::trim(commandline);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline);
    detail::split_program_name(&nstr,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    if (((this->name_)._M_string_length == 0) || (this->has_automatic_name_ == true)) {
      this->has_automatic_name_ = true;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->name_,
                 &nstr.first);
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,
               &nstr.second);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&nstr);
  }
  if (commandline->_M_string_length != 0) {
    ::std::__cxx11::string::string
              (local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        commandline);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"=",(allocator<char> *)&args);
    detail::find_and_modify<unsigned_long(*)(std::__cxx11::string&,unsigned_long)>
              ((string *)&nstr,(detail *)local_a0,&local_c0,(string *)detail::escape_detect,in_R8);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,
               &nstr.first);
    ::std::__cxx11::string::~string((string *)&nstr);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string(local_a0);
    if (this->allow_windows_style_options_ == true) {
      ::std::__cxx11::string::string
                (local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          commandline);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,":",(allocator<char> *)&args);
      detail::find_and_modify<unsigned_long(*)(std::__cxx11::string&,unsigned_long)>
                ((string *)&nstr,(detail *)local_e0,&local_100,(string *)detail::escape_detect,in_R8
                );
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,
                 &nstr.first);
      ::std::__cxx11::string::~string((string *)&nstr);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::__cxx11::string::~string(local_e0);
    }
  }
  ::std::__cxx11::string::string
            (&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline);
  detail::split_up(&args,(string *)&local_60,'\0');
  ::std::__cxx11::string::~string((string *)&local_60);
  nstr.first._M_dataplus._M_p = (pointer)&nstr.first.field_2;
  nstr.first._M_string_length = 0;
  nstr.first.field_2._M_local_buf[0] = '\0';
  __first = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&nstr.first);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&args,(const_iterator)__first._M_current,
          (const_iterator)
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  ::std::__cxx11::string::~string((string *)&nstr);
  detail::remove_quotes(&args);
  ::std::
  __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  parse(this,&args);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return;
}

Assistant:

CLI11_INLINE void App::parse(std::string commandline, bool program_name_included) {

    if(program_name_included) {
        auto nstr = detail::split_program_name(commandline);
        if((name_.empty()) || (has_automatic_name_)) {
            has_automatic_name_ = true;
            name_ = nstr.first;
        }
        commandline = std::move(nstr.second);
    } else {
        detail::trim(commandline);
    }
    // the next section of code is to deal with quoted arguments after an '=' or ':' for windows like operations
    if(!commandline.empty()) {
        commandline = detail::find_and_modify(commandline, "=", detail::escape_detect);
        if(allow_windows_style_options_)
            commandline = detail::find_and_modify(commandline, ":", detail::escape_detect);
    }

    auto args = detail::split_up(std::move(commandline));
    // remove all empty strings
    args.erase(std::remove(args.begin(), args.end(), std::string{}), args.end());
    try {
        detail::remove_quotes(args);
    } catch(const std::invalid_argument &arg) {
        throw CLI::ParseError(arg.what(), CLI::ExitCodes::InvalidError);
    }
    std::reverse(args.begin(), args.end());
    parse(std::move(args));
}